

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPostEvent>::copyAppend
          (QGenericArrayOps<QPostEvent> *this,QPostEvent *b,QPostEvent *e)

{
  QPostEvent *pQVar1;
  QPostEvent *pQVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  QPostEvent *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QPostEvent>::begin((QArrayDataPointer<QPostEvent> *)0x34ed77);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pQVar2 = pQVar1 + *(long *)(in_RDI + 0x10);
      pQVar2->receiver = (QObject *)*local_10;
      pQVar2->event = (QEvent *)local_10[1];
      *(undefined8 *)&pQVar2->priority = local_10[2];
      local_10 = local_10 + 3;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }